

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testAddIntegerNoTags_Test::~Engine_testAddIntegerNoTags_Test
          (Engine_testAddIntegerNoTags_Test *this)

{
  void *in_RDI;
  
  ~Engine_testAddIntegerNoTags_Test((Engine_testAddIntegerNoTags_Test *)0x1301e8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Engine, testAddIntegerNoTags) {
    Engine e("test", std::make_unique<TestHandler>());
    e.Add("foo", 100000000);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->intMeasures.size());
    auto im = th->intMeasures[0];
    ASSERT_EQ("test.foo", im.name);
    ASSERT_EQ(MetricType::Counter, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100000000, im.value);
    ASSERT_EQ(0, im.tags.size());
}